

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O2

void __thiscall
QtConcurrent::ThreadEngineBase::handleException(ThreadEngineBase *this,QException *exception)

{
  char cVar1;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QException *)this->futureInterface == (QException *)0x0) {
    local_28.m_mutex = &this->mutex;
    local_28.m_isLocked = true;
    local_28._9_7_ = 0xaaaaaaaaaaaaaa;
    QBasicMutex::lock(local_28.m_mutex);
    local_28.m_isLocked = true;
    cVar1 = QtPrivate::ExceptionStore::hasException();
    if (cVar1 == '\0') {
      QtPrivate::ExceptionStore::setException((QException *)&this->exceptionStore);
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QFutureInterfaceBase::reportException((QException *)this->futureInterface);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ThreadEngineBase::handleException(const QException &exception)
{
    if (futureInterface) {
        futureInterface->reportException(exception);
    } else {
        QMutexLocker lock(&mutex);
        if (!exceptionStore.hasException())
            exceptionStore.setException(exception);
    }
}